

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_HTMLtree(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  xmlDocPtr pxVar13;
  FILE *pFVar14;
  xmlDocPtr pxVar15;
  htmlDocPtr pxVar16;
  xmlBufferPtr pxVar17;
  xmlDocPtr pxVar18;
  int iVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  undefined8 uVar20;
  int n_format;
  uint uVar21;
  int iVar22;
  uint uVar23;
  undefined *puVar24;
  int n_cur_1;
  ulong uVar25;
  xmlDocPtr in_RSI;
  int n_format_1;
  undefined4 *puVar26;
  int n_encoding;
  int n_format_3;
  int n_doc;
  int iVar27;
  undefined8 *puVar28;
  int test_ret_1;
  int test_ret_2;
  int test_ret_4;
  int test_ret;
  int test_ret_7;
  int test_ret_9;
  uint local_5c;
  undefined8 local_58;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing HTMLtree : 18 of 18 functions ...");
  }
  iVar19 = 0;
  local_5c = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar5 = 0;
    do {
      uVar25 = 0;
      do {
        puVar26 = &DAT_00158240;
        pxVar15 = (xmlDocPtr)0x0;
        do {
          iVar4 = (int)in_RSI;
          iVar3 = xmlMemBlocks();
          if (bVar1) {
            iVar4 = 0;
            lVar12 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar12 = 0;
          }
          pxVar13 = gen_xmlDocPtr(uVar5,iVar4);
          if ((uint)uVar25 < 3) {
            uVar20 = (&DAT_0015ad48)[uVar25];
          }
          else {
            uVar20 = 0;
          }
          in_RSI = pxVar13;
          htmlDocContentDumpFormatOutput(lVar12,pxVar13,uVar20,*puVar26);
          call_tests = call_tests + 1;
          if (lVar12 != 0) {
            xmlOutputBufferClose(lVar12);
          }
          if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
            xmlFreeDoc(pxVar13);
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          iVar6 = (int)pxVar15;
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlDocContentDumpFormatOutput",
                   (ulong)(uint)(iVar4 - iVar3));
            iVar19 = iVar19 + 1;
            printf(" %d",(ulong)local_5c);
            printf(" %d",(ulong)uVar5);
            printf(" %d",uVar25);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar15;
          }
          uVar21 = iVar6 + 1;
          pxVar15 = (xmlDocPtr)(ulong)uVar21;
          puVar26 = puVar26 + 1;
        } while (uVar21 != 4);
        uVar21 = (uint)uVar25 + 1;
        uVar25 = (ulong)uVar21;
      } while (uVar21 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_5c = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  local_5c = 0;
  local_48 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar5 = 0;
    do {
      puVar28 = &DAT_0015ad48;
      pxVar15 = (xmlDocPtr)0x0;
      do {
        iVar4 = (int)in_RSI;
        iVar3 = xmlMemBlocks();
        if (bVar1) {
          iVar4 = 0;
          lVar12 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          lVar12 = 0;
        }
        pxVar13 = gen_xmlDocPtr(uVar5,iVar4);
        uVar21 = (uint)pxVar15;
        if (uVar21 < 3) {
          uVar20 = *puVar28;
        }
        else {
          uVar20 = 0;
        }
        in_RSI = pxVar13;
        htmlDocContentDumpOutput(lVar12,pxVar13,uVar20);
        call_tests = call_tests + 1;
        if (lVar12 != 0) {
          xmlOutputBufferClose(lVar12);
        }
        if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
          xmlFreeDoc(pxVar13);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocContentDumpOutput",(ulong)(uint)(iVar4 - iVar3))
          ;
          local_5c = local_5c + 1;
          printf(" %d",local_48);
          printf(" %d",(ulong)uVar5);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar15;
        }
        uVar21 = uVar21 + 1;
        pxVar15 = (xmlDocPtr)(ulong)uVar21;
        puVar28 = puVar28 + 1;
      } while (uVar21 != 4);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_48 = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  local_4c = 0;
  uVar5 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar21 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      if (bVar1) {
        iVar4 = 0x14caad;
        pFVar14 = fopen64("test.out","a+");
      }
      else {
        pFVar14 = (FILE *)0x0;
      }
      pxVar15 = gen_xmlDocPtr(uVar21,iVar4);
      in_RSI = pxVar15;
      htmlDocDump(pFVar14);
      call_tests = call_tests + 1;
      if (pFVar14 != (FILE *)0x0) {
        fclose(pFVar14);
      }
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc(pxVar15);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlDocDump",(ulong)(uint)(iVar4 - iVar3));
        local_4c = local_4c + 1;
        printf(" %d",(ulong)uVar5);
        in_RSI = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar5 = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar5 = 0;
  do {
    pxVar15 = (xmlDocPtr)0x0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      iVar6 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      pxVar13 = gen_xmlDocPtr(uVar5,iVar6);
      uVar20 = 0;
      if (bVar1) {
        uVar20 = 0x15d438;
      }
      in_RSI = (xmlDocPtr)0x0;
      htmlDocDumpMemory(pxVar13,0,uVar20);
      call_tests = call_tests + 1;
      if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
        xmlFreeDoc(pxVar13);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlDocDumpMemory",(ulong)(uint)(iVar6 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar5);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar15;
      }
      pxVar15 = (xmlDocPtr)0x1;
      bVar2 = false;
    } while (bVar1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  iVar19 = local_5c + iVar19;
  iVar3 = local_4c + iVar3;
  iVar4 = 0;
  uVar5 = 0;
  do {
    local_58 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      pxVar15 = (xmlDocPtr)0x0;
      uVar20 = 0;
      if (bVar1) {
        uVar20 = 0x15d438;
      }
      puVar26 = &DAT_00158240;
      do {
        iVar7 = (int)in_RSI;
        iVar6 = xmlMemBlocks();
        pxVar13 = gen_xmlDocPtr(uVar5,iVar7);
        in_RSI = (xmlDocPtr)0x0;
        htmlDocDumpMemoryFormat(pxVar13,0,uVar20,*puVar26);
        call_tests = call_tests + 1;
        if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
          xmlFreeDoc(pxVar13);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        iVar8 = (int)pxVar15;
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlDocDumpMemoryFormat",(ulong)(uint)(iVar7 - iVar6));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar5);
          printf(" %d",0);
          printf(" %d",local_58);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar15;
        }
        uVar21 = iVar8 + 1;
        pxVar15 = (xmlDocPtr)(ulong)uVar21;
        puVar26 = puVar26 + 1;
      } while (uVar21 != 4);
      local_58 = 1;
      bVar2 = false;
    } while (bVar1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  function_tests = function_tests + 1;
  uVar5 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    pxVar16 = gen_htmlDocPtr(uVar5,(int)in_RSI);
    htmlGetMetaEncoding(pxVar16);
    call_tests = call_tests + 1;
    if (((pxVar16 != (htmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
      xmlFreeDoc(pxVar16);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlGetMetaEncoding",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar5;
      printf(" %d");
      putchar(10);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 3);
  function_tests = function_tests + 1;
  puVar28 = &DAT_0015ad60;
  uVar5 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar5 < 4) {
      uVar20 = *puVar28;
    }
    else {
      uVar20 = 0;
    }
    htmlIsBooleanAttr(uVar20);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsBooleanAttr",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d");
      putchar(10);
    }
    uVar5 = uVar5 + 1;
    puVar28 = puVar28 + 1;
  } while (uVar5 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar5 = 0;
  do {
    iVar9 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar5 < 4) {
        uVar20 = (&DAT_0015ad60)[uVar5];
      }
      else {
        uVar20 = 0;
      }
      pxVar15 = (xmlDocPtr)htmlNewDoc(uVar20);
      if (((pxVar15 != (xmlDocPtr)0x0) && (api_doc != pxVar15)) && (pxVar15->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDoc",(ulong)(uint)(iVar11 - iVar10));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar5);
        printf(" %d");
        putchar(10);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar5 = 0;
  do {
    puVar28 = &DAT_0015ad60;
    uVar21 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar5 < 4) {
        uVar20 = (&DAT_0015ad60)[uVar5];
      }
      else {
        uVar20 = 0;
      }
      if (uVar21 < 4) {
        pxVar15 = (xmlDocPtr)*puVar28;
      }
      else {
        pxVar15 = (xmlDocPtr)0x0;
      }
      pxVar13 = (xmlDocPtr)htmlNewDocNoDtD(uVar20);
      if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewDocNoDtD",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar5);
        pxVar15 = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar28 = puVar28 + 1;
    } while (uVar21 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  function_tests = function_tests + 1;
  local_38 = 0;
  uVar5 = 0;
  do {
    uVar21 = 0;
    do {
      pxVar13 = (xmlDocPtr)0x0;
      do {
        iVar10 = (int)pxVar15;
        iVar11 = xmlMemBlocks();
        pxVar17 = gen_xmlBufferPtr(uVar5,iVar10);
        pxVar18 = gen_xmlDocPtr(uVar21,iVar10);
        iVar22 = (int)pxVar13;
        pxVar15 = (xmlDocPtr)gen_xmlNodePtr(iVar22,iVar10);
        htmlNodeDump(pxVar17,pxVar18,pxVar15);
        call_tests = call_tests + 1;
        iVar10 = extraout_EDX;
        if (pxVar17 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar17);
          iVar10 = extraout_EDX_00;
        }
        if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
          xmlFreeDoc(pxVar18);
          iVar10 = extraout_EDX_01;
        }
        des_xmlNodePtr(iVar22,(xmlNodePtr)pxVar15,iVar10);
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar11 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDump",(ulong)(uint)(iVar10 - iVar11));
          local_38 = local_38 + 1;
          printf(" %d",(ulong)uVar5);
          printf(" %d",(ulong)uVar21);
          printf(" %d");
          putchar(10);
          pxVar15 = pxVar13;
        }
        pxVar13 = (xmlDocPtr)(ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 3);
  function_tests = function_tests + 1;
  local_5c = 0;
  local_48 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar5 = 0;
    do {
      pxVar13 = (xmlDocPtr)0x0;
      do {
        iVar11 = (int)pxVar15;
        iVar10 = xmlMemBlocks();
        if (bVar1) {
          iVar11 = 0x14caad;
          pFVar14 = fopen64("test.out","a+");
        }
        else {
          pFVar14 = (FILE *)0x0;
        }
        pxVar18 = gen_xmlDocPtr(uVar5,iVar11);
        iVar22 = (int)pxVar13;
        pxVar15 = (xmlDocPtr)gen_xmlNodePtr(iVar22,iVar11);
        htmlNodeDumpFile(pFVar14,pxVar18,pxVar15);
        call_tests = call_tests + 1;
        iVar11 = extraout_EDX_02;
        if (pFVar14 != (FILE *)0x0) {
          fclose(pFVar14);
          iVar11 = extraout_EDX_03;
        }
        if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
          xmlFreeDoc(pxVar18);
          iVar11 = extraout_EDX_04;
        }
        des_xmlNodePtr(iVar22,(xmlNodePtr)pxVar15,iVar11);
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlNodeDumpFile",(ulong)(uint)(iVar11 - iVar10));
          local_5c = local_5c + 1;
          printf(" %d",local_48);
          printf(" %d",(ulong)uVar5);
          printf(" %d");
          putchar(10);
          pxVar15 = pxVar13;
        }
        pxVar13 = (xmlDocPtr)(ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_48 = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  local_38 = local_38 + local_5c;
  local_34 = 0;
  local_4c = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    local_5c = 0;
    do {
      uVar25 = 0;
      do {
        uVar5 = 0;
        do {
          puVar26 = &DAT_00158240;
          pxVar13 = (xmlDocPtr)0x0;
          do {
            iVar11 = (int)pxVar15;
            iVar10 = xmlMemBlocks();
            if (bVar1) {
              iVar11 = 0x14caad;
              pFVar14 = fopen64("test.out","a+");
            }
            else {
              pFVar14 = (FILE *)0x0;
            }
            pxVar18 = gen_xmlDocPtr(local_5c,iVar11);
            iVar22 = (int)uVar25;
            pxVar15 = (xmlDocPtr)gen_xmlNodePtr(iVar22,iVar11);
            if (uVar5 < 3) {
              uVar20 = (&DAT_0015ad48)[uVar5];
            }
            else {
              uVar20 = 0;
            }
            htmlNodeDumpFileFormat(pFVar14,pxVar18,pxVar15,uVar20,*puVar26);
            call_tests = call_tests + 1;
            iVar11 = extraout_EDX_05;
            if (pFVar14 != (FILE *)0x0) {
              fclose(pFVar14);
              iVar11 = extraout_EDX_06;
            }
            if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc))
            {
              xmlFreeDoc(pxVar18);
              iVar11 = extraout_EDX_07;
            }
            des_xmlNodePtr(iVar22,(xmlNodePtr)pxVar15,iVar11);
            xmlResetLastError();
            iVar11 = xmlMemBlocks();
            iVar27 = (int)pxVar13;
            if (iVar10 != iVar11) {
              iVar11 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFileFormat",
                     (ulong)(uint)(iVar11 - iVar10));
              local_34 = local_34 + 1;
              printf(" %d",(ulong)local_4c);
              printf(" %d",(ulong)local_5c);
              printf(" %d",uVar25);
              printf(" %d",(ulong)uVar5);
              printf(" %d");
              putchar(10);
              pxVar15 = pxVar13;
            }
            uVar21 = iVar27 + 1;
            pxVar13 = (xmlDocPtr)(ulong)uVar21;
            puVar26 = puVar26 + 1;
          } while (uVar21 != 4);
          uVar5 = uVar5 + 1;
        } while (uVar5 != 4);
        uVar25 = (ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      local_5c = local_5c + 1;
    } while (local_5c != 4);
    local_4c = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  iVar19 = local_38 + iVar3 + iVar19 + iVar4 + iVar6 + iVar7 + iVar8 + iVar9 + local_34;
  local_34 = 0;
  local_4c = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    local_5c = 0;
    do {
      uVar25 = 0;
      do {
        uVar5 = 0;
        do {
          puVar26 = &DAT_00158240;
          pxVar13 = (xmlDocPtr)0x0;
          do {
            iVar4 = (int)pxVar15;
            iVar3 = xmlMemBlocks();
            if (bVar1) {
              iVar4 = 0;
              lVar12 = xmlOutputBufferCreateFilename("test.out",0,0);
            }
            else {
              lVar12 = 0;
            }
            pxVar18 = gen_xmlDocPtr(local_5c,iVar4);
            iVar6 = (int)uVar25;
            pxVar15 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar4);
            if (uVar5 < 3) {
              uVar20 = (&DAT_0015ad48)[uVar5];
            }
            else {
              uVar20 = 0;
            }
            htmlNodeDumpFormatOutput(lVar12,pxVar18,pxVar15,uVar20,*puVar26);
            call_tests = call_tests + 1;
            iVar4 = extraout_EDX_08;
            if (lVar12 != 0) {
              xmlOutputBufferClose(lVar12);
              iVar4 = extraout_EDX_09;
            }
            if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc))
            {
              xmlFreeDoc(pxVar18);
              iVar4 = extraout_EDX_10;
            }
            des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar15,iVar4);
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            iVar7 = (int)pxVar13;
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlNodeDumpFormatOutput",
                     (ulong)(uint)(iVar4 - iVar3));
              local_34 = local_34 + 1;
              printf(" %d",(ulong)local_4c);
              printf(" %d",(ulong)local_5c);
              printf(" %d",uVar25);
              printf(" %d",(ulong)uVar5);
              printf(" %d");
              putchar(10);
              pxVar15 = pxVar13;
            }
            uVar21 = iVar7 + 1;
            pxVar13 = (xmlDocPtr)(ulong)uVar21;
            puVar26 = puVar26 + 1;
          } while (uVar21 != 4);
          uVar5 = uVar5 + 1;
        } while (uVar5 != 4);
        uVar25 = (ulong)(iVar6 + 1U);
      } while (iVar6 + 1U != 3);
      local_5c = local_5c + 1;
    } while (local_5c != 4);
    local_4c = 1;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  local_4c = 0;
  local_40 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    uVar5 = 0;
    do {
      uVar25 = 0;
      do {
        pxVar13 = (xmlDocPtr)0x0;
        puVar28 = &DAT_0015ad48;
        do {
          iVar4 = (int)pxVar15;
          iVar3 = xmlMemBlocks();
          if (bVar1) {
            iVar4 = 0;
            lVar12 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            lVar12 = 0;
          }
          pxVar18 = gen_xmlDocPtr(uVar5,iVar4);
          iVar6 = (int)uVar25;
          pxVar15 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar4);
          uVar21 = (uint)pxVar13;
          if (uVar21 < 3) {
            uVar20 = *puVar28;
          }
          else {
            uVar20 = 0;
          }
          htmlNodeDumpOutput(lVar12,pxVar18,pxVar15,uVar20);
          call_tests = call_tests + 1;
          iVar4 = extraout_EDX_11;
          if (lVar12 != 0) {
            xmlOutputBufferClose(lVar12);
            iVar4 = extraout_EDX_12;
          }
          if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
            xmlFreeDoc(pxVar18);
            iVar4 = extraout_EDX_13;
          }
          des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar15,iVar4);
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlNodeDumpOutput",(ulong)(uint)(iVar4 - iVar3));
            local_4c = local_4c + 1;
            printf(" %d",local_40);
            printf(" %d",(ulong)uVar5);
            printf(" %d",uVar25);
            printf(" %d");
            putchar(10);
            pxVar15 = pxVar13;
          }
          uVar21 = uVar21 + 1;
          pxVar13 = (xmlDocPtr)(ulong)uVar21;
          puVar28 = puVar28 + 1;
        } while (uVar21 != 4);
        uVar25 = (ulong)(iVar6 + 1U);
      } while (iVar6 + 1U != 3);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    local_40 = 1;
    iVar3 = 0;
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  uVar25 = 0;
  do {
    pxVar13 = (xmlDocPtr)0x0;
    do {
      iVar6 = (int)pxVar15;
      iVar4 = xmlMemBlocks();
      if ((uint)uVar25 < 5) {
        puVar24 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar25];
      }
      else {
        puVar24 = (undefined *)0x0;
      }
      iVar7 = (int)pxVar13;
      pxVar18 = gen_xmlDocPtr(iVar7,iVar6);
      pxVar15 = pxVar18;
      htmlSaveFile(puVar24);
      call_tests = call_tests + 1;
      if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
        xmlFreeDoc(pxVar18);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSaveFile",(ulong)(uint)(iVar6 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",uVar25);
        printf(" %d");
        putchar(10);
        pxVar15 = pxVar13;
      }
      uVar5 = iVar7 + 1;
      pxVar13 = (xmlDocPtr)(ulong)uVar5;
    } while (uVar5 != 4);
    uVar5 = (uint)uVar25 + 1;
    uVar25 = (ulong)uVar5;
  } while (uVar5 != 6);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar5 = 0;
  do {
    uVar21 = 0;
    do {
      pxVar13 = (xmlDocPtr)0x0;
      puVar28 = &DAT_0015ad48;
      do {
        iVar7 = (int)pxVar15;
        iVar6 = xmlMemBlocks();
        if (uVar5 < 5) {
          puVar24 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar5];
        }
        else {
          puVar24 = (undefined *)0x0;
        }
        pxVar18 = gen_xmlDocPtr(uVar21,iVar7);
        uVar23 = (uint)pxVar13;
        if (uVar23 < 3) {
          uVar20 = *puVar28;
        }
        else {
          uVar20 = 0;
        }
        pxVar15 = pxVar18;
        htmlSaveFileEnc(puVar24,pxVar18,uVar20);
        call_tests = call_tests + 1;
        if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
          xmlFreeDoc(pxVar18);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSaveFileEnc",(ulong)(uint)(iVar7 - iVar6));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar5);
          printf(" %d",(ulong)uVar21);
          printf(" %d");
          putchar(10);
          pxVar15 = pxVar13;
        }
        uVar23 = uVar23 + 1;
        pxVar13 = (xmlDocPtr)(ulong)uVar23;
        puVar28 = puVar28 + 1;
      } while (uVar23 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 6);
  function_tests = function_tests + 1;
  local_5c = 0;
  uVar5 = 0;
  do {
    uVar21 = 0;
    do {
      uVar25 = 0;
      do {
        puVar26 = &DAT_00158240;
        pxVar13 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)pxVar15;
          iVar6 = xmlMemBlocks();
          if (uVar5 < 5) {
            puVar24 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar5];
          }
          else {
            puVar24 = (undefined *)0x0;
          }
          pxVar18 = gen_xmlDocPtr(uVar21,iVar7);
          if ((uint)uVar25 < 3) {
            uVar20 = (&DAT_0015ad48)[uVar25];
          }
          else {
            uVar20 = 0;
          }
          pxVar15 = pxVar18;
          htmlSaveFileFormat(puVar24,pxVar18,uVar20,*puVar26);
          call_tests = call_tests + 1;
          if (((pxVar18 != (xmlDocPtr)0x0) && (api_doc != pxVar18)) && (pxVar18->doc != api_doc)) {
            xmlFreeDoc(pxVar18);
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          iVar8 = (int)pxVar13;
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlSaveFileFormat",(ulong)(uint)(iVar7 - iVar6));
            local_5c = local_5c + 1;
            printf(" %d",(ulong)uVar5);
            printf(" %d",(ulong)uVar21);
            printf(" %d",uVar25);
            printf(" %d");
            putchar(10);
            pxVar15 = pxVar13;
          }
          uVar23 = iVar8 + 1;
          pxVar13 = (xmlDocPtr)(ulong)uVar23;
          puVar26 = puVar26 + 1;
        } while (uVar23 != 4);
        uVar23 = (uint)uVar25 + 1;
        uVar25 = (ulong)uVar23;
      } while (uVar23 != 4);
      uVar21 = uVar21 + 1;
    } while (uVar21 != 4);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 6);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar5 = 0;
  do {
    puVar28 = &DAT_0015ad60;
    uVar21 = 0;
    do {
      iVar8 = (int)pxVar15;
      iVar7 = xmlMemBlocks();
      pxVar16 = gen_htmlDocPtr(uVar5,iVar8);
      if (uVar21 < 4) {
        pxVar15 = (xmlDocPtr)*puVar28;
      }
      else {
        pxVar15 = (xmlDocPtr)0x0;
      }
      htmlSetMetaEncoding(pxVar16);
      call_tests = call_tests + 1;
      if (((pxVar16 != (htmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
        xmlFreeDoc(pxVar16);
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlSetMetaEncoding",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar5);
        pxVar15 = (xmlDocPtr)(ulong)uVar21;
        printf(" %d");
        putchar(10);
      }
      uVar21 = uVar21 + 1;
      puVar28 = puVar28 + 1;
    } while (uVar21 != 5);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 3);
  function_tests = function_tests + 1;
  uVar5 = iVar3 + iVar4 + iVar19 + local_34 + local_4c + local_5c + iVar6;
  if (uVar5 != 0) {
    printf("Module HTMLtree: %d errors\n",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static int
test_HTMLtree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLtree : 18 of 18 functions ...\n");
    test_ret += test_htmlDocContentDumpFormatOutput();
    test_ret += test_htmlDocContentDumpOutput();
    test_ret += test_htmlDocDump();
    test_ret += test_htmlDocDumpMemory();
    test_ret += test_htmlDocDumpMemoryFormat();
    test_ret += test_htmlGetMetaEncoding();
    test_ret += test_htmlIsBooleanAttr();
    test_ret += test_htmlNewDoc();
    test_ret += test_htmlNewDocNoDtD();
    test_ret += test_htmlNodeDump();
    test_ret += test_htmlNodeDumpFile();
    test_ret += test_htmlNodeDumpFileFormat();
    test_ret += test_htmlNodeDumpFormatOutput();
    test_ret += test_htmlNodeDumpOutput();
    test_ret += test_htmlSaveFile();
    test_ret += test_htmlSaveFileEnc();
    test_ret += test_htmlSaveFileFormat();
    test_ret += test_htmlSetMetaEncoding();

    if (test_ret != 0)
	printf("Module HTMLtree: %d errors\n", test_ret);
    return(test_ret);
}